

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunPrepareSsaExit(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  VmFunction *function_00;
  VmFunction *function;
  VmValue *value_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  function_00 = getType<VmFunction>(value);
  if (function_00 != (VmFunction *)0x0) {
    module->currentFunction = function_00;
    IsolatePhiNodes(module,function_00);
    VmFunction::UpdateLiveSets(function_00,module);
    ColorPhiWebs(function_00);
    DecoalesceMergedSets(ctx,function_00);
    SequentializeParallelCopies(ctx,module,function_00);
    VmFunction::UpdateLiveSets(function_00,module);
    module->currentFunction = (VmFunction *)0x0;
  }
  return;
}

Assistant:

void RunPrepareSsaExit(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		module->currentFunction = function;

		// Remove interferences between phi instruction registers by introducing copies
		IsolatePhiNodes(module, function);

		function->UpdateLiveSets(module);

		// Mark each phi-copy instuction web with a color
		ColorPhiWebs(function);

		// Remove colors from registers that introduce interferences between registers
		DecoalesceMergedSets(ctx, function);

		SequentializeParallelCopies(ctx, module, function);

		function->UpdateLiveSets(module);

		module->currentFunction = NULL;
	}
}